

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOCommunicationsNode.cpp
# Opt level: O0

int __thiscall DIS::IOCommunicationsNode::getMarshalledSize(IOCommunicationsNode *this)

{
  int iVar1;
  int marshalSize;
  IOCommunicationsNode *this_local;
  
  iVar1 = EntityID::getMarshalledSize(&this->_communicationsNode);
  return iVar1 + 10;
}

Assistant:

int IOCommunicationsNode::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 4;  // _recordType
   marshalSize = marshalSize + 2;  // _recordLength
   marshalSize = marshalSize + 1;  // _communcationsNodeType
   marshalSize = marshalSize + 1;  // _padding
   marshalSize = marshalSize + _communicationsNode.getMarshalledSize();  // _communicationsNode
   marshalSize = marshalSize + 2;  // _elementID
    return marshalSize;
}